

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.cpp
# Opt level: O0

void __thiscall
DOCTEST_ANON_SUITE_2::throw_on_move::throw_on_move(throw_on_move *this,throw_on_move *param_1)

{
  runtime_error *this_00;
  string local_38;
  throw_on_move *local_18;
  throw_on_move *param_1_local;
  throw_on_move *this_local;
  
  local_18 = param_1;
  param_1_local = this;
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  burst::literals::operator____u8s_abi_cxx11_(&local_38,anon_var_dwarf_200e42,9);
  std::runtime_error::runtime_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

throw_on_move (throw_on_move &&)
        {
            throw std::runtime_error(u8"Пока!"_u8s);
        }